

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.hpp
# Opt level: O2

void __thiscall qe::Loader<7U>::load(Loader<7U> *this)

{
  string *psVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  istream *piVar6;
  loader_error *plVar7;
  uint uVar8;
  ulong uVar9;
  vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  indices;
  string line;
  vec3 v;
  undefined1 local_4c4 [4];
  value_type local_4c0;
  vector<qe::subobj_t,_std::allocator<qe::subobj_t>_> *local_4b8;
  Loader<7U> *local_4b0;
  value_type local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  tnormals;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  tvertices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  string local_3b8;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  ifstream file;
  byte abStack_218 [488];
  
  psVar1 = &this->_path;
  local_4b0 = this;
  std::ifstream::ifstream(&file,(string *)psVar1,_S_in);
  std::ios::exceptions((int)&file + (int)*(undefined8 *)(_file + -0x18));
  tvertices.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tvertices.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tvertices.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tnormals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tnormals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tnormals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indices.
  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  indices.
  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.
  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_4a8,"",(allocator *)&line);
  local_4a8.index = 0;
  local_4a8.size = 0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  local_4b8 = &local_4b0->_objects;
  while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&file,(string *)&line,'\n'),
        ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
    std::__cxx11::string::string((string *)&local_2d8,(string *)&line);
    std::__cxx11::string::string((string *)&local_258,"v ",(allocator *)&local_478);
    bVar4 = startswith(&local_2d8,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_2d8);
    if (bVar4) {
      iVar5 = __isoc99_sscanf(line._M_dataplus._M_p,"v %f %f %f",&v,
                              (undefined1 *)((long)&v.field_0 + 4),
                              (undefined1 *)((long)&v.field_0 + 8));
      if (iVar5 + 1U < 2) {
        plVar7 = (loader_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&local_418,(string *)psVar1);
        std::operator+(&local_3f8,&local_418,"(");
        std::operator+(&local_478,&local_3f8,&line);
        std::operator+(&local_2f8,&local_478,")");
        loader_error::loader_error
                  (plVar7,&local_2f8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                   ,0x10b);
        __cxa_throw(plVar7,&loader_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back(&tvertices,&v);
    }
    else {
      std::__cxx11::string::string((string *)&local_318,(string *)&line);
      std::__cxx11::string::string((string *)&local_278,"vn ",(allocator *)&local_478);
      bVar4 = startswith(&local_318,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_318);
      if (bVar4) {
        iVar5 = __isoc99_sscanf(line._M_dataplus._M_p,"vn %f %f %f",&v,
                                (undefined1 *)((long)&v.field_0 + 4),
                                (undefined1 *)((long)&v.field_0 + 8));
        if (iVar5 + 1U < 2) {
          plVar7 = (loader_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string((string *)&local_418,(string *)psVar1);
          std::operator+(&local_3f8,&local_418,"(");
          std::operator+(&local_478,&local_3f8,&line);
          std::operator+(&local_338,&local_478,")");
          loader_error::loader_error
                    (plVar7,&local_338,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                     ,0x115);
          __cxa_throw(plVar7,&loader_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back(&tnormals,&v);
      }
      else {
        std::__cxx11::string::string((string *)&local_358,(string *)&line);
        std::__cxx11::string::string((string *)&local_298,"f ",(allocator *)&local_478);
        bVar4 = startswith(&local_358,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_358);
        if (bVar4) {
          iVar5 = __isoc99_sscanf(line._M_dataplus._M_p,"f %u//%u %u//%u %u//%u",&v,
                                  (undefined1 *)((long)&v.field_0 + 4),
                                  (undefined1 *)((long)&v.field_0 + 8),local_4c4);
          if (iVar5 + 1U < 2) {
            plVar7 = (loader_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string((string *)&local_418,(string *)psVar1);
            std::operator+(&local_3f8,&local_418," (");
            std::operator+(&local_478,&local_3f8,&line);
            std::operator+(&local_378,&local_478,")");
            loader_error::loader_error
                      (plVar7,&local_378,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                       ,0x122);
            __cxa_throw(plVar7,&loader_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::
          vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
          ::push_back(&indices,(value_type *)&v);
          std::
          vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
          ::push_back(&indices,(value_type *)((long)&v.field_0 + 8));
          std::
          vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
          ::push_back(&indices,&local_4c0);
        }
        else {
          std::__cxx11::string::string((string *)&local_398,(string *)&line);
          std::__cxx11::string::string((string *)&local_2b8,"o ",(allocator *)&local_478);
          bVar4 = startswith(&local_398,&local_2b8);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_398);
          if (bVar4) {
            local_4a8.size =
                 ((long)indices.
                        super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)indices.
                        super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) - local_4a8.index;
            if (local_4a8.name._M_string_length == 0) {
              std::__cxx11::string::assign((char *)&local_4a8);
            }
            std::vector<qe::subobj_t,_std::allocator<qe::subobj_t>_>::push_back
                      (local_4b8,&local_4a8);
            std::__cxx11::string::substr((ulong)&local_478,(ulong)&line);
            std::__cxx11::string::operator=((string *)&local_4a8,(string *)&local_478);
            std::__cxx11::string::~string((string *)&local_478);
            local_4a8.index =
                 (long)indices.
                       super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)indices.
                       super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&line);
  local_4a8.size =
       ((long)indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) - local_4a8.index;
  if (local_4a8.name._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&local_4a8);
  }
  std::vector<qe::subobj_t,_std::allocator<qe::subobj_t>_>::push_back(local_4b8,&local_4a8);
  if ((abStack_218[*(long *)(_file + -0x18)] & 1) == 0) {
    if ((long)indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      plVar7 = (loader_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&line,(string *)psVar1);
      std::operator+(&local_3d8,&line," (no indices found)");
      loader_error::loader_error
                (plVar7,&local_3d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                 ,0x137);
      __cxa_throw(plVar7,&loader_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar8 = 0;
    if ((ulong)((long)indices.
                      super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)indices.
                      super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) % 3 != 0) {
      __assert_fail("indices.size() % 3 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                    ,0x139,"void qe::Loader<7>::load()");
    }
    while( true ) {
      uVar9 = (ulong)uVar8;
      if ((ulong)((long)indices.
                        super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)indices.
                        super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9) {
        std::__cxx11::string::~string((string *)&local_4a8);
        std::
        _Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
        ::~_Vector_base(&indices.
                         super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       );
        std::
        _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::~_Vector_base(&tnormals.
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       );
        std::
        _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::~_Vector_base(&tvertices.
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       );
        std::ifstream::~ifstream(&file);
        return;
      }
      uVar2 = indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar9].field_0.field_0.x;
      if ((ulong)(((long)tvertices.
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)tvertices.
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xc) < (ulong)uVar2) break;
      uVar3 = indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar9].field_0.field_0.y;
      if ((ulong)(((long)tnormals.
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)tnormals.
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xc) < (ulong)uVar3) {
        __assert_fail("indices[i].y <= tnormals.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                      ,0x13d,"void qe::Loader<7>::load()");
      }
      std::vector<qe::objv3_point_t,std::allocator<qe::objv3_point_t>>::
      emplace_back<glm::vec<3,float,(glm::qualifier)0>&,glm::vec<3,float,(glm::qualifier)0>&>
                ((vector<qe::objv3_point_t,std::allocator<qe::objv3_point_t>> *)local_4b0,
                 tvertices.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)(int)uVar2 + -1,
                 tnormals.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)(int)uVar3 + -1);
      uVar8 = uVar8 + 1;
    }
    __assert_fail("indices[i].x <= tvertices.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                  ,0x13c,"void qe::Loader<7>::load()");
  }
  plVar7 = (loader_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_3b8,(string *)psVar1);
  loader_error::loader_error
            (plVar7,&local_3b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
             ,0x135);
  __cxa_throw(plVar7,&loader_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void load() {
            std::ifstream file(_path);
            file.exceptions(std::ifstream::badbit);
            std::vector<glm::vec3> tvertices;
            std::vector<glm::vec3> tnormals;
            std::vector<glm::uvec2> indices;

            subobj_t tobj {"", 0, 0};

            for(std::string line; std::getline(file, line, '\n');) {
                if(startswith(line, "v ")) {
                    glm::vec3 v;

                    switch(sscanf(line.c_str(), "v %f %f %f", &v.x, &v.y, &v.z)) {
                    case 0:
                    case EOF:
                        throw loader_error(std::string(_path) + "(" + line + ")", __FILE__, __LINE__);
                    }

                    tvertices.push_back(v);
                } else if(startswith(line, "vn ")) {
                    glm::vec3 v;

                    switch(sscanf(line.c_str(), "vn %f %f %f", &v.x, &v.y, &v.z)) {
                    case 0:
                    case EOF:
                        throw loader_error(std::string(_path) + "(" + line + ")", __FILE__, __LINE__);
                    }

                    tnormals.push_back(v);
                } else if(startswith(line, "f ")) {
                    std::array<glm::uvec2, 3> points;

                    switch(sscanf(line.c_str(), "f %u//%u %u//%u %u//%u",
                                  &points[0].x, &points[0].y,
                                  &points[1].x, &points[1].y,
                                  &points[2].x, &points[2].y)) {
                    case 0:
                    case EOF:
                        throw loader_error(std::string(_path) + " (" + line + ")", __FILE__, __LINE__);
                    }

                    indices.push_back(points[0]);
                    indices.push_back(points[1]);
                    indices.push_back(points[2]);
                } else if(startswith(line, "o ")) {
                    tobj.size = indices.size() - tobj.index;
                    if(tobj.name.empty()) tobj.name = "FIRSTNONAME";
                    _objects.push_back(tobj);
                    tobj.name = line.substr(2);
                    tobj.index = indices.size();
                }
            }

            tobj.size = indices.size() - tobj.index;
            if(tobj.name.empty()) tobj.name = "NONAME";
            _objects.push_back(tobj);

            if(file.bad()) throw loader_error(_path, __FILE__, __LINE__);

            if(indices.size() == 0) throw loader_error(std::string(_path) + " (no indices found)", __FILE__, __LINE__);

            assert(indices.size() % 3 == 0);

            for(unsigned int i = 0; i < indices.size(); ++i) {
                assert(indices[i].x <= tvertices.size());
                assert(indices[i].y <= tnormals.size());
                glm::ivec2 index = indices[i];
                _points.emplace_back(tvertices[index.x - 1], tnormals[index.y - 1]);
            }
        }